

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

sds duckdb_hll::sdsmapchars(sds s,char *from,char *to,size_t setlen)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = sdslen(s);
  sVar2 = 0;
  do {
    if (sVar2 == sVar1) {
      return s;
    }
    for (sVar3 = 0; setlen != sVar3; sVar3 = sVar3 + 1) {
      if (s[sVar2] == from[sVar3]) {
        s[sVar2] = to[sVar3];
        break;
      }
    }
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

sds sdsmapchars(sds s, const char *from, const char *to, size_t setlen) {
    size_t j, i, l = sdslen(s);

    for (j = 0; j < l; j++) {
        for (i = 0; i < setlen; i++) {
            if (s[j] == from[i]) {
                s[j] = to[i];
                break;
            }
        }
    }
    return s;
}